

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O2

void __thiscall
wasm::SubtypingDiscoverer<NullFixer>::visitStructNew
          (SubtypingDiscoverer<NullFixer> *this,StructNew *curr)

{
  Type *this_00;
  bool bVar1;
  Struct *pSVar2;
  Expression **ppEVar3;
  size_t i;
  size_t index;
  size_t sVar4;
  long lVar5;
  HeapType local_40;
  SubtypingDiscoverer<NullFixer> *local_38;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type;
  local_38 = this;
  bVar1 = wasm::Type::isStruct(this_00);
  if ((bVar1) &&
     ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0)) {
    local_40 = wasm::Type::getHeapType(this_00);
    pSVar2 = HeapType::getStruct(&local_40);
    sVar4 = (long)(pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    if (sVar4 != (curr->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/subtype-exprs.h"
                    ,0x13a,
                    "void wasm::SubtypingDiscoverer<NullFixer>::visitStructNew(StructNew *) [SubType = NullFixer]"
                   );
    }
    local_38 = local_38 + -0x58;
    lVar5 = 0;
    for (index = 0; sVar4 != index; index = index + 1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(curr->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,index);
      StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
      Type_(local_38,*ppEVar3,
            (Type)*(uintptr_t *)
                   ((long)&(((pSVar2->fields).
                             super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                             super__Vector_impl_data._M_start)->type).id + lVar5));
      lVar5 = lVar5 + 0x10;
    }
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (!curr->type.isStruct() || curr->isWithDefault()) {
      return;
    }
    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());
    for (size_t i = 0, size = fields.size(); i < size; ++i) {
      self()->noteSubtype(curr->operands[i], fields[i].type);
    }
  }